

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void init_motion_compensation_hex(search_site_config *cfg,int stride,int level)

{
  uint uVar1;
  FULLPEL_MV FVar2;
  int *piVar3;
  int iVar4;
  FULLPEL_MV (*paFVar5) [8];
  ulong uVar6;
  long lVar7;
  
  cfg->stride = stride;
  piVar3 = &cfg->site[0][0].offset;
  iVar4 = 1;
  paFVar5 = init_motion_compensation_hex::hex_candidates;
  for (lVar7 = 0; lVar7 != 0xb; lVar7 = lVar7 + 1) {
    uVar1 = init_motion_compensation_hex::hex_num_candidates[lVar7];
    cfg->searches_per_step[lVar7] = uVar1;
    cfg->radius[lVar7] = iVar4;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      FVar2 = (*paFVar5)[uVar6];
      *(FULLPEL_MV *)(piVar3 + uVar6 * 2 + -1) = FVar2;
      piVar3[uVar6 * 2] = ((int)FVar2 >> 0x10) + FVar2.row * stride;
    }
    iVar4 = iVar4 * 2;
    piVar3 = piVar3 + 0x22;
    paFVar5 = paFVar5 + 1;
  }
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

static void init_motion_compensation_hex(search_site_config *cfg, int stride,
                                         int level) {
  (void)level;
  cfg->stride = stride;
  // First scale has 8-closest points, the rest have 6 points in hex shape
  // at increasing scales.
  static const int hex_num_candidates[MAX_PATTERN_SCALES] = { 8, 6, 6, 6, 6, 6,
                                                              6, 6, 6, 6, 6 };
  // Note that the largest candidate step at each scale is 2^scale.
  /* clang-format off */
    static const FULLPEL_MV
        hex_candidates[MAX_PATTERN_SCALES][MAX_PATTERN_CANDIDATES] = {
        { { -1, -1 }, { 0, -1 }, { 1, -1 }, { 1, 0 }, { 1, 1 }, { 0, 1 },
          { -1, 1 }, { -1, 0 } },
        { { -1, -2 }, { 1, -2 }, { 2, 0 }, { 1, 2 }, { -1, 2 }, { -2, 0 } },
        { { -2, -4 }, { 2, -4 }, { 4, 0 }, { 2, 4 }, { -2, 4 }, { -4, 0 } },
        { { -4, -8 }, { 4, -8 }, { 8, 0 }, { 4, 8 }, { -4, 8 }, { -8, 0 } },
        { { -8, -16 }, { 8, -16 }, { 16, 0 }, { 8, 16 },
          { -8, 16 }, { -16, 0 } },
        { { -16, -32 }, { 16, -32 }, { 32, 0 }, { 16, 32 }, { -16, 32 },
          { -32, 0 } },
        { { -32, -64 }, { 32, -64 }, { 64, 0 }, { 32, 64 }, { -32, 64 },
          { -64, 0 } },
        { { -64, -128 }, { 64, -128 }, { 128, 0 }, { 64, 128 },
          { -64, 128 }, { -128, 0 } },
        { { -128, -256 }, { 128, -256 }, { 256, 0 }, { 128, 256 },
          { -128, 256 }, { -256, 0 } },
        { { -256, -512 }, { 256, -512 }, { 512, 0 }, { 256, 512 },
          { -256, 512 }, { -512, 0 } },
        { { -512, -1024 }, { 512, -1024 }, { 1024, 0 }, { 512, 1024 },
          { -512, 1024 }, { -1024, 0 } },
    };

  /* clang-format on */
  int radius = 1;
  for (int i = 0; i < MAX_PATTERN_SCALES; ++i) {
    cfg->searches_per_step[i] = hex_num_candidates[i];
    cfg->radius[i] = radius;
    for (int j = 0; j < hex_num_candidates[i]; ++j) {
      search_site *const site = &cfg->site[i][j];
      site->mv = hex_candidates[i][j];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    radius *= 2;
  }
  cfg->num_search_steps = MAX_PATTERN_SCALES;
}